

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int envy_bios_parse_mem_train_ptrn(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_mem_train_ptrn *peVar6;
  envy_bios_mem_train_ptrn_entry *peVar7;
  envy_bios_mem_train_ptrn_entry *entry;
  int i;
  int err;
  envy_bios_mem_train_ptrn *mtp;
  envy_bios *bios_local;
  
  peVar6 = &(bios->mem).train_ptrn;
  if (peVar6->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar1 = bios_u8(bios,(uint)peVar6->offset,&(bios->mem).train_ptrn.version);
    iVar2 = bios_u8(bios,peVar6->offset + 1,&(bios->mem).train_ptrn.hlen);
    iVar3 = bios_u8(bios,peVar6->offset + 2,&(bios->mem).train_ptrn.rlen);
    iVar4 = bios_u8(bios,peVar6->offset + 3,&(bios->mem).train_ptrn.subentrylen);
    iVar5 = bios_u8(bios,peVar6->offset + 4,&(bios->mem).train_ptrn.entriesnum);
    (bios->mem).train_ptrn.subentries = '\x01';
    if (iVar5 == 0 && (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0)))) {
      envy_bios_block(bios,(uint)peVar6->offset,
                      (uint)(bios->mem).train_ptrn.hlen +
                      (uint)(bios->mem).train_ptrn.rlen * (uint)(bios->mem).train_ptrn.entriesnum,
                      "MEM TRAIN PATTERN",-1);
      peVar7 = (envy_bios_mem_train_ptrn_entry *)calloc((ulong)(bios->mem).train_ptrn.entriesnum,6);
      (bios->mem).train_ptrn.entries = peVar7;
      if ((bios->mem).train_ptrn.entries == (envy_bios_mem_train_ptrn_entry *)0x0) {
        bios_local._4_4_ = -0xc;
      }
      else {
        for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->mem).train_ptrn.entriesnum;
            entry._0_4_ = (int)entry + 1) {
          peVar7 = (bios->mem).train_ptrn.entries + (int)entry;
          peVar7->offset =
               peVar6->offset + (ushort)(bios->mem).train_ptrn.hlen +
               ((ushort)(bios->mem).train_ptrn.rlen +
               (ushort)(bios->mem).train_ptrn.subentries *
               (ushort)(bios->mem).train_ptrn.subentrylen) * (short)(int)entry;
          bios_u8(bios,(uint)peVar7->offset,&peVar7->bits);
          peVar7->bits = peVar7->bits & 0x3f;
          bios_u8(bios,peVar7->offset + 1,&peVar7->modulo);
          if ((bios->mem).train_ptrn.rlen < 4) {
            peVar7->indirect = '\0';
            peVar7->indirect_entry = (uint8_t)(int)entry;
          }
          else {
            bios_u8(bios,peVar7->offset + 2,&peVar7->indirect);
            peVar7->indirect = (peVar7->indirect & 7) == 2;
            bios_u8(bios,peVar7->offset + 3,&peVar7->indirect_entry);
          }
        }
        (bios->mem).train_ptrn.valid = '\x01';
        bios_local._4_4_ = 0;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int
envy_bios_parse_mem_train_ptrn(struct envy_bios *bios) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	if (!mtp->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mtp->offset, &mtp->version);
	err |= bios_u8(bios, mtp->offset+1, &mtp->hlen);
	err |= bios_u8(bios, mtp->offset+2, &mtp->rlen);
	err |= bios_u8(bios, mtp->offset+3, &mtp->subentrylen);
	err |= bios_u8(bios, mtp->offset+4, &mtp->entriesnum);
	mtp->subentries = 1;
	if (err)
		return -EFAULT;

	envy_bios_block(bios, mtp->offset,
			mtp->hlen + mtp->rlen * mtp->entriesnum,
			"MEM TRAIN PATTERN", -1);

	mtp->entries = calloc(mtp->entriesnum, sizeof *mtp->entries);
	if (!mtp->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mtp->entriesnum; i++) {
		struct envy_bios_mem_train_ptrn_entry *entry = &mtp->entries[i];
		entry->offset = mtp->offset + mtp->hlen +
				((mtp->rlen + mtp->subentries * mtp->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->bits);
		entry->bits &= 0x3f;
		err |= bios_u8(bios, entry->offset+1, &entry->modulo);
		if (mtp->rlen >= 4) {
			err |= bios_u8(bios, entry->offset+2, &entry->indirect);
			entry->indirect = (entry->indirect & 0x7) == 0x2;
			err |= bios_u8(bios, entry->offset+3, &entry->indirect_entry);
		} else {
			entry->indirect = 0;
			entry->indirect_entry = i;
		}
	}
	mtp->valid = 1;
	return 0;
}